

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * AnalyzeConditional(ExpressionContext *ctx,SynConditional *syntax)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ExprBase *pEVar5;
  ExprBase *expr;
  SynBase *expr_00;
  ExprBase *pEVar6;
  TypeUnsizedArray *pTVar7;
  ScopeData *pSVar8;
  undefined4 extraout_var_00;
  TypeUnsizedArray *type;
  ScopeData *pSVar9;
  ScopeData *pSVar10;
  TypeUnsizedArray *local_40;
  undefined4 extraout_var;
  
  pEVar5 = AnalyzeExpression(ctx,syntax->condition);
  pEVar5 = CreateConditionCast(ctx,pEVar5->source,pEVar5);
  AssertValueExpression(ctx,&syntax->super_SynBase,pEVar5);
  expr = AnalyzeStatement(ctx,syntax->trueBlock);
  expr_00 = (SynBase *)AnalyzeStatement(ctx,syntax->falseBlock);
  if ((((pEVar5->type != (TypeBase *)0x0) && (pEVar5->type->typeID == 0)) ||
      ((expr->type != (TypeBase *)0x0 && (expr->type->typeID == 0)))) ||
     (((((TypeBase *)expr_00->end != (TypeBase *)0x0 && (((TypeBase *)expr_00->end)->typeID == 0))
       || (bVar3 = AssertValueExpression(ctx,&syntax->super_SynBase,expr), !bVar3)) ||
      (bVar3 = AssertValueExpression(ctx,&syntax->super_SynBase,(ExprBase *)expr_00), !bVar3)))) {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    local_40 = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
    goto LAB_0016cd01;
  }
  type = (TypeUnsizedArray *)expr_00->end;
  if ((TypeUnsizedArray *)expr->type != type) {
    pTVar7 = (TypeUnsizedArray *)ctx->typeNullPtr;
    if ((TypeUnsizedArray *)expr->type == pTVar7) {
      expr = CreateCast(ctx,syntax->trueBlock,expr,(TypeBase *)type,false);
      type = (TypeUnsizedArray *)expr_00->end;
      pTVar7 = (TypeUnsizedArray *)ctx->typeNullPtr;
    }
    if (type == pTVar7) {
      expr_00 = (SynBase *)CreateCast(ctx,syntax->falseBlock,(ExprBase *)expr_00,expr->type,false);
      type = (TypeUnsizedArray *)expr_00->end;
    }
  }
  local_40 = (TypeUnsizedArray *)expr->type;
  if (local_40 != type) {
    bVar3 = ExpressionContext::IsNumericType(ctx,(TypeBase *)local_40);
    if ((bVar3) && (bVar3 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type), bVar3)) {
      local_40 = (TypeUnsizedArray *)
                 ExpressionContext::GetBinaryOpResultType(ctx,(TypeBase *)local_40,(TypeBase *)type)
      ;
    }
    else {
      if ((local_40 == (TypeUnsizedArray *)0x0) ||
         (pTVar7 = local_40, (local_40->super_TypeStruct).super_TypeBase.typeID != 0x13)) {
        pTVar7 = (TypeUnsizedArray *)0x0;
      }
      if (((type == (TypeUnsizedArray *)0x0) || (pTVar7 == (TypeUnsizedArray *)0x0)) ||
         (((type->super_TypeStruct).super_TypeBase.typeID != 0x13 ||
          (pSVar8 = (pTVar7->super_TypeStruct).typeScope,
          pSVar8 != (type->super_TypeStruct).typeScope)))) {
        if ((local_40 == (TypeUnsizedArray *)0x0) ||
           (pTVar7 = local_40, (local_40->super_TypeStruct).super_TypeBase.typeID != 0x12)) {
          pTVar7 = (TypeUnsizedArray *)0x0;
        }
        if (((type != (TypeUnsizedArray *)0x0) && (pTVar7 != (TypeUnsizedArray *)0x0)) &&
           ((type->super_TypeStruct).super_TypeBase.typeID == 0x12)) {
          pSVar8 = (pTVar7->super_TypeStruct).typeScope;
          if ((pSVar8 == (ScopeData *)0x0) || (pSVar8->uniqueId != 0x18)) {
            pSVar8 = (ScopeData *)0x0;
          }
          pSVar10 = (type->super_TypeStruct).typeScope;
          if ((pSVar10 == (ScopeData *)0x0) || (pSVar10->uniqueId != 0x18)) {
            pSVar10 = (ScopeData *)0x0;
          }
          if (pSVar8 != (ScopeData *)0x0) {
            iVar4 = -1;
            pSVar9 = pSVar8;
            do {
              if (pSVar9 == pSVar10) {
                if (iVar4 != 0) {
                  expr = CreateCast(ctx,syntax->trueBlock,expr,(TypeBase *)type,false);
                  local_40 = type;
                  goto LAB_0016cef5;
                }
                break;
              }
              pSVar9 = (ScopeData *)(pSVar9->scopes).allocator;
              iVar4 = iVar4 + -1;
            } while (pSVar9 != (ScopeData *)0x0);
          }
          if (pSVar10 != (ScopeData *)0x0) {
            iVar4 = -1;
            do {
              if (pSVar10 == pSVar8) {
                if (iVar4 != 0) {
                  expr_00 = (SynBase *)
                            CreateCast(ctx,syntax->falseBlock,(ExprBase *)expr_00,(TypeBase *)pTVar7
                                       ,false);
                  local_40 = pTVar7;
                  goto LAB_0016cef5;
                }
                break;
              }
              pSVar10 = (ScopeData *)(pSVar10->scopes).allocator;
              iVar4 = iVar4 + -1;
            } while (pSVar10 != (ScopeData *)0x0);
          }
        }
        pcVar1 = (local_40->super_TypeStruct).super_TypeBase.name.begin;
        pcVar2 = (type->super_TypeStruct).super_TypeBase.name.begin;
        anon_unknown.dwarf_c3752::Report
                  (ctx,&syntax->super_SynBase,
                   "ERROR: can\'t find common type between \'%.*s\' and \'%.*s\'",
                   (ulong)(uint)(*(int *)&(local_40->super_TypeStruct).super_TypeBase.name.end -
                                (int)pcVar1),pcVar1,
                   (ulong)(uint)(*(int *)&(type->super_TypeStruct).super_TypeBase.name.end -
                                (int)pcVar2),pcVar2);
        local_40 = (TypeUnsizedArray *)ExpressionContext::GetErrorType(ctx);
        goto LAB_0016cef5;
      }
      local_40 = ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)pSVar8);
    }
    expr = CreateCast(ctx,syntax->trueBlock,expr,(TypeBase *)local_40,false);
    expr_00 = (SynBase *)
              CreateCast(ctx,syntax->falseBlock,(ExprBase *)expr_00,(TypeBase *)local_40,false);
  }
LAB_0016cef5:
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
LAB_0016cd01:
  pEVar6->typeID = 0x18;
  pEVar6->source = &syntax->super_SynBase;
  pEVar6->type = (TypeBase *)local_40;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240d90;
  pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar5;
  *(ExprBase **)&pEVar6[1].typeID = expr;
  pEVar6[1].source = expr_00;
  return pEVar6;
}

Assistant:

ExprBase* AnalyzeConditional(ExpressionContext &ctx, SynConditional *syntax)
{
	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	AssertValueExpression(ctx, syntax, condition);

	ExprBase *trueBlock = AnalyzeStatement(ctx, syntax->trueBlock);
	ExprBase *falseBlock = AnalyzeStatement(ctx, syntax->falseBlock);

	if(isType<TypeError>(condition->type) || isType<TypeError>(trueBlock->type) || isType<TypeError>(falseBlock->type))
		return new (ctx.get<ExprConditional>()) ExprConditional(syntax, ctx.GetErrorType(), condition, trueBlock, falseBlock);

	if(!AssertValueExpression(ctx, syntax, trueBlock))
		return new (ctx.get<ExprConditional>()) ExprConditional(syntax, ctx.GetErrorType(), condition, trueBlock, falseBlock);

	if(!AssertValueExpression(ctx, syntax, falseBlock))
		return new (ctx.get<ExprConditional>()) ExprConditional(syntax, ctx.GetErrorType(), condition, trueBlock, falseBlock);

	// Handle null pointer promotion
	if(trueBlock->type != falseBlock->type)
	{
		if(trueBlock->type == ctx.typeNullPtr)
			trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, falseBlock->type, false);

		if(falseBlock->type == ctx.typeNullPtr)
			falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, trueBlock->type, false);
	}

	TypeBase *resultType = NULL;

	if(trueBlock->type == falseBlock->type)
	{
		resultType = trueBlock->type;
	}
	else if(ctx.IsNumericType(trueBlock->type) && ctx.IsNumericType(falseBlock->type))
	{
		resultType = ctx.GetBinaryOpResultType(trueBlock->type, falseBlock->type);

		trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, resultType, false);
		falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, resultType, false);
	}
	else
	{
		TypeArray *trueBlockTypeArray = getType<TypeArray>(trueBlock->type);
		TypeArray *falseBlockTypeArray = getType<TypeArray>(falseBlock->type);

		if(trueBlockTypeArray && falseBlockTypeArray && trueBlockTypeArray->subType == falseBlockTypeArray->subType)
		{
			resultType = ctx.GetUnsizedArrayType(trueBlockTypeArray->subType);

			trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, resultType, false);
			falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, resultType, false);
		}
		else
		{
			TypeRef *trueBlockTypeRef = getType<TypeRef>(trueBlock->type);
			TypeRef *falseBlockTypeRef = getType<TypeRef>(falseBlock->type);

			if(trueBlockTypeRef && falseBlockTypeRef)
			{
				TypeClass *trueBlockTypeClass = getType<TypeClass>(trueBlockTypeRef->subType);
				TypeClass *falseBlockTypeClass = getType<TypeClass>(falseBlockTypeRef->subType);

				if(IsDerivedFrom(trueBlockTypeClass, falseBlockTypeClass))
				{
					resultType = falseBlockTypeRef;

					trueBlock = CreateCast(ctx, syntax->trueBlock, trueBlock, resultType, false);
				}
				else if(IsDerivedFrom(falseBlockTypeClass, trueBlockTypeClass))
				{
					resultType = trueBlockTypeRef;

					falseBlock = CreateCast(ctx, syntax->falseBlock, falseBlock, resultType, false);
				}
			}

			if(!resultType)
			{
				Report(ctx, syntax, "ERROR: can't find common type between '%.*s' and '%.*s'", FMT_ISTR(trueBlock->type->name), FMT_ISTR(falseBlock->type->name));

				resultType = ctx.GetErrorType();
			}
		}
	}

	return new (ctx.get<ExprConditional>()) ExprConditional(syntax, resultType, condition, trueBlock, falseBlock);
}